

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::QualifiedIdentifier::QualifiedIdentifier
          (QualifiedIdentifier *this,Context *c,IdentifierPath *path)

{
  pool_ptr<soul::AST::Expression> local_90;
  IdentifierPath local_88;
  IdentifierPath *local_20;
  IdentifierPath *path_local;
  Context *c_local;
  QualifiedIdentifier *this_local;
  
  local_20 = path;
  path_local = (IdentifierPath *)c;
  c_local = (Context *)this;
  Expression::Expression(&this->super_Expression,QualifiedIdentifier,c,unknown);
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__QualifiedIdentifier_00585500;
  std::
  vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
  ::vector(&this->pathSections);
  IdentifierPath::IdentifierPath(&this->pathPrefix);
  IdentifierPath::IdentifierPath(&local_88,path);
  pool_ptr<soul::AST::Expression>::pool_ptr(&local_90,(void *)0x0);
  addToPath(this,&local_88,&local_90);
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_90);
  IdentifierPath::~IdentifierPath(&local_88);
  return;
}

Assistant:

QualifiedIdentifier (const Context& c, IdentifierPath path)
            : Expression (ObjectType::QualifiedIdentifier, c, ExpressionKind::unknown)
        {
            addToPath (path, nullptr);
        }